

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O1

int load_public_key(EC_KEY **pub_key,uint8_t *spki)

{
  int iVar1;
  EC_KEY *key;
  int iVar2;
  long in_FS_OFFSET;
  uint8_t *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *pub_key = (EC_KEY *)0x0;
  iVar2 = 0;
  local_20 = spki;
  key = d2i_EC_PUBKEY((EC_KEY **)0x0,&local_20,0x5b);
  *pub_key = (EC_KEY *)key;
  if (key != (EC_KEY *)0x0) {
    iVar1 = EC_KEY_check_key(key);
    if (iVar1 != 0) goto LAB_001125bf;
    EC_KEY_free((EC_KEY *)*pub_key);
    *pub_key = (EC_KEY *)0x0;
  }
  iVar2 = -2;
LAB_001125bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int load_public_key(EC_KEY **pub_key, uint8_t *spki)
{
	char *p = NULL;
	int status = 0;

	p = (char *)spki;
	*pub_key = NULL;

	/* This whole procedure is one way to copy the spki into
	 * an EC_KEY, suggested by OpenSSL. Basically, this function
	 * returns the public key as a long int, which can later be
	 * casted to an EC_KEY
	 */
	*pub_key = d2i_EC_PUBKEY(NULL, (const unsigned char **)&p, (long)SPKI_SIZE);

	if (!*pub_key)
		return RTR_BGPSEC_LOAD_PUB_KEY_ERROR;

	status = EC_KEY_check_key(*pub_key);
	if (status == 0) {
		EC_KEY_free(*pub_key);
		*pub_key = NULL;
		return RTR_BGPSEC_LOAD_PUB_KEY_ERROR;
	}

	return RTR_BGPSEC_SUCCESS;
}